

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

index_t __thiscall
GEO::Delaunay3dThread::stellate_conflict_zone_iterative
          (Delaunay3dThread *this,index_t v_in,index_t t1,index_t t1fbord,index_t t1fprev)

{
  int iVar1;
  pointer pFVar2;
  pointer piVar3;
  pointer pFVar4;
  uint8 uVar5;
  bool bVar6;
  index_t iVar7;
  pointer piVar8;
  ulong uVar9;
  index_t iVar10;
  uint uVar11;
  signed_index_t t2_1;
  index_t iVar12;
  index_t t1fborder;
  uint uVar13;
  uint uVar14;
  index_t t2ft1;
  index_t t2;
  index_t t2fbord;
  uint local_60;
  index_t local_5c;
  index_t local_58;
  uint local_54;
  StellateConflictStack *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_50 = &this->S2_;
  std::
  vector<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
  ::resize(&local_50->store_,
           ((long)(this->S2_).store_.
                  super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->S2_).store_.
                  super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 + 1);
  pFVar2 = (this->S2_).store_.
           super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar2[-1].t1 = t1;
  pFVar2[-1].t1fbord = (uint8)t1fbord;
  pFVar2[-1].t1fprev = (uint8)t1fprev;
  local_58 = v_in;
  do {
    iVar12 = local_58;
    t1fborder = t1fbord & 0xff;
    uVar11 = t1fprev & 0xff;
    piVar8 = (this->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start + t1 * 4;
    local_48 = *(undefined8 *)piVar8;
    uStack_40 = *(undefined8 *)(piVar8 + 2);
    iVar7 = new_tetrahedron(this);
    piVar3 = (this->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = piVar3 + iVar7 * 4;
    *(undefined8 *)piVar8 = local_48;
    *(undefined8 *)(piVar8 + 2) = uStack_40;
    uVar13 = t1fborder + iVar7 * 4;
    piVar3[uVar13] = iVar12;
    piVar8 = (this->cell_to_cell_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
             ).super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar8[t1fborder + t1 * 4];
    piVar8[uVar13] = iVar1;
    uVar9 = (ulong)(uint)(iVar1 * 4);
    piVar8[((uint)(piVar8[uVar9 + 1] == t1) + (uint)(piVar8[uVar9 + 2] == t1) * 2 |
           (uint)(piVar8[uVar9 + 3] == t1) * 3) + iVar1 * 4] = iVar7;
    uVar13 = 0;
    iVar12 = t1;
LAB_00181856:
    if (3 < uVar13) {
      pFVar2 = (this->S2_).store_.
               super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar4 = (this->S2_).store_.
               super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->S2_).store_.
      super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish = pFVar4 + -1;
      if (pFVar2 == pFVar4 + -1) {
        return iVar7;
      }
      iVar12 = pFVar4[-2].t1;
      iVar10 = pFVar4[-2].new_t;
      t1fborder = (index_t)pFVar4[-2].t1fbord;
      uVar11 = (uint)pFVar4[-2].t1fprev;
      uVar13 = (uint)pFVar4[-2].t1ft2;
      local_60 = (uint)pFVar4[-2].t2ft1;
      local_5c = iVar7;
LAB_001818ab:
      piVar8[local_60 + local_5c * 4] = iVar10;
      piVar8[iVar10 * 4 + uVar13] = local_5c;
      uVar14 = uVar13;
      iVar7 = iVar10;
LAB_001818c7:
      uVar13 = uVar14 + 1;
      goto LAB_00181856;
    }
    uVar14 = uVar11;
    if ((uVar13 == uVar11) || (uVar14 = uVar13, piVar8[uVar13 + iVar7 * 4] != -1))
    goto LAB_001818c7;
    bVar6 = get_neighbor_along_conflict_zone_border
                      (this,iVar12,t1fborder,uVar13,&local_5c,&local_54,&local_60);
    uVar14 = local_54;
    t1 = local_5c;
    if (bVar6) {
      piVar8 = (this->cell_to_cell_store_->
               super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
               super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar10 = iVar7;
      goto LAB_001818ab;
    }
    uVar5 = (uint8)local_60;
    pFVar2 = (this->S2_).store_.
             super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pFVar2[-1].new_t = iVar7;
    pFVar2[-1].t1ft2 = (uint8)uVar13;
    pFVar2[-1].t2ft1 = (uint8)local_60;
    t1fbord = local_54 & 0xff;
    t1fprev = local_60 & 0xff;
    std::
    vector<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
    ::resize(&local_50->store_,
             ((long)pFVar2 -
              (long)(this->S2_).store_.
                    super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 + 1);
    pFVar2 = (this->S2_).store_.
             super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pFVar2[-1].t1 = t1;
    pFVar2[-1].t1fbord = (uint8)uVar14;
    pFVar2[-1].t1fprev = uVar5;
  } while( true );
}

Assistant:

index_t stellate_conflict_zone_iterative(
            index_t v_in, index_t t1, index_t t1fbord,
            index_t t1fprev = index_t(-1)
        ) {
            //   This function is de-recursified because some degenerate
            // inputs can cause stack overflow (system stack is limited to
            // a few megs). For instance, it can happen when a large number
            // of points are on the same sphere exactly.
            
            //   To de-recursify, it uses class StellateConflictStack
            // that emulates system's stack for storing functions's
            // parameters and local variables in all the nested stack
            // frames. 
        
            signed_index_t v = signed_index_t(v_in);
            
            S2_.push(t1, t1fbord, t1fprev);
            
            index_t new_t;   // the newly created tetrahedron.
            
            index_t t1ft2;   // traverses the 4 facets of t1.
            
            index_t t2;      // the tetrahedron on the border of
                             // the conflict zone that shares an
                             // edge with t1 along t1ft2.
            
            index_t t2fbord; // the facet of t2 on the border of
                             // the conflict zone.
        
            index_t t2ft1;   // the facet of t2 that is incident to t1.
        
        entry_point:
            S2_.get_parameters(t1, t1fbord, t1fprev);


            geo_debug_assert(owns_tet(t1));
            geo_debug_assert(tet_adjacent(t1,t1fbord)>=0);
            geo_debug_assert(owns_tet(index_t(tet_adjacent(t1,t1fbord))));
            geo_debug_assert(tet_is_marked_as_conflict(t1));
            geo_debug_assert(
                !tet_is_marked_as_conflict(index_t(tet_adjacent(t1,t1fbord)))
            );

            // Create new tetrahedron with same vertices as t_bndry
            new_t = new_tetrahedron(
                tet_vertex(t1,0),
                tet_vertex(t1,1),
                tet_vertex(t1,2),
                tet_vertex(t1,3)
            );

            // Replace in new_t the vertex opposite to t1fbord with v
            set_tet_vertex(new_t, t1fbord, v);
            
            // Connect new_t with t1's neighbor accros t1fbord
            {
                index_t tbord = index_t(tet_adjacent(t1,t1fbord));
                set_tet_adjacent(new_t, t1fbord, tbord);
                set_tet_adjacent(tbord, find_tet_adjacent(tbord,t1), new_t);
            }
            
            //  Lookup new_t's neighbors accros its three other
            // facets and connect them
            for(t1ft2=0; t1ft2<4; ++t1ft2) {
                
                if(t1ft2 == t1fprev || tet_adjacent(new_t,t1ft2) != -1) {
                    continue;
                }
                
                // Get t1's neighbor along the border of the conflict zone
                if(!get_neighbor_along_conflict_zone_border(
                       t1,t1fbord,t1ft2, t2,t2fbord,t2ft1
                )) {
                    //   If t1's neighbor is not a new tetrahedron,
                    // create a new tetrahedron through a recursive call.
                    S2_.save_locals(new_t, t1ft2, t2ft1);
                    S2_.push(t2, t2fbord, t2ft1);
                    goto entry_point;

                return_point:
                    // This is the return value of the called function.
                    index_t result = new_t;
                    S2_.pop();
                    
                    // Special case: we were in the outermost frame, 
                    // then we (truly) return from the function.
                    if(S2_.empty()) {
                        return result;
                    }
                    
                    S2_.get_parameters(t1, t1fbord, t1fprev);
                    S2_.get_locals(new_t, t1ft2, t2ft1); 
                    t2 = result; 
                }
                
                set_tet_adjacent(t2, t2ft1, new_t);
                set_tet_adjacent(new_t, t1ft2, t2);
            }

            // Except for the initial call (see "Special case" above),
            // the nested calls all come from the same location,
            // thus there is only one possible return point
            // (no need to push any return address).
            goto return_point;
        }